

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

void Dau_DsdNormalize_rec(char *pStr,char **p,int *pMatches)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  byte *pbVar9;
  byte *__dest;
  int local_68 [14];
  
  pbVar1 = (byte *)*p;
  do {
    bVar2 = *pbVar1;
    pbVar9 = pbVar1;
    if (bVar2 == 0x21) {
      pbVar9 = pbVar1 + 1;
      *p = (char *)pbVar9;
      bVar2 = pbVar1[1];
    }
    if ((byte)(bVar2 + 0xbf) < 6 || (byte)(bVar2 - 0x30) < 10) {
      do {
        pbVar9 = pbVar9 + 1;
        *p = (char *)pbVar9;
        bVar2 = *pbVar9;
      } while ((byte)(bVar2 - 0x30) < 10 || (byte)(bVar2 + 0xbf) < 6);
    }
    if (bVar2 == 0x3c) {
      bVar2 = 0x3c;
      if (pStr[(long)pMatches[(long)pbVar9 - (long)pStr] + 1] == '{') {
        pbVar9 = (byte *)(pStr + (long)pMatches[(long)pbVar9 - (long)pStr] + 1);
        *p = (char *)pbVar9;
        bVar2 = *pbVar9;
        goto LAB_004b937d;
      }
    }
    else {
LAB_004b937d:
      if ((byte)(bVar2 + 0x9f) < 0x1a) {
        return;
      }
      uVar3 = (uint)bVar2;
      if (uVar3 < 0x5b) {
        if (uVar3 != 0x3c) {
          if (uVar3 != 0x28) {
LAB_004b9536:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                          ,0x102,"void Dau_DsdNormalize_rec(char *, char **, int *)");
          }
LAB_004b942b:
          if (uVar3 + (bVar2 != 0x28) + 1 != (int)pStr[pMatches[(long)pbVar9 - (long)pStr]]) {
            __assert_fail("*q == **p + 1 + (**p != \'(\')",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                          ,0xe1,"void Dau_DsdNormalize_rec(char *, char **, int *)");
          }
          __dest = pbVar9 + 1;
          pbVar9 = (byte *)(pStr + pMatches[(long)pbVar9 - (long)pStr]);
          *p = (char *)__dest;
          uVar5 = 0;
          pbVar1 = __dest;
          if (__dest < pbVar9) {
            uVar5 = 0;
            do {
              local_68[uVar5] = (int)pbVar1 - (int)pStr;
              uVar5 = uVar5 + 1;
              Dau_DsdNormalize_rec(pStr,p,pMatches);
              pbVar1 = (byte *)(*p + 1);
              *p = (char *)pbVar1;
            } while (pbVar1 < pbVar9);
          }
          uVar8 = uVar5 & 0xffffffff;
          local_68[uVar8] = (int)pbVar1 - (int)pStr;
          if (pbVar1 == pbVar9) {
            Dau_DsdNormalizePerm(pStr,local_68,(int)uVar5);
            pcVar4 = Dau_DsdNormalize_rec::pBuffer;
            if (uVar8 != 0) {
              pcVar4 = Dau_DsdNormalize_rec::pBuffer;
              uVar5 = 0;
              do {
                lVar6 = (long)Dau_DsdNormalizePerm::pPerm[uVar5];
                lVar7 = (long)local_68[lVar6];
                if (local_68[lVar6] < local_68[lVar6 + 1]) {
                  do {
                    *pcVar4 = pStr[lVar7];
                    pcVar4 = pcVar4 + 1;
                    lVar7 = lVar7 + 1;
                  } while (lVar7 < local_68[lVar6 + 1]);
                }
                uVar5 = uVar5 + 1;
              } while (uVar5 != uVar8);
            }
            if (pcVar4 + -0xcb4080 == *p + -(long)__dest) {
              memcpy(__dest,Dau_DsdNormalize_rec::pBuffer,(size_t)(pcVar4 + -0xcb4080));
              return;
            }
            __assert_fail("pStore - pBuffer == *p - pOld",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                          ,0xef,"void Dau_DsdNormalize_rec(char *, char **, int *)");
          }
          __assert_fail("*p == q",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                        ,0xe8,"void Dau_DsdNormalize_rec(char *, char **, int *)");
        }
      }
      else if (uVar3 != 0x7b) {
        if (uVar3 != 0x5b) goto LAB_004b9536;
        goto LAB_004b942b;
      }
    }
    if (bVar2 + 2 != (int)pStr[pMatches[(long)pbVar9 - (long)pStr]]) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0xf6,"void Dau_DsdNormalize_rec(char *, char **, int *)");
    }
    pbVar1 = (byte *)(pStr + pMatches[(long)pbVar9 - (long)pStr]);
    if ((bVar2 != 0x3c) || (pbVar1[1] != 0x7b)) {
      while( true ) {
        pbVar9 = pbVar9 + 1;
        *p = (char *)pbVar9;
        if (pbVar1 <= pbVar9) break;
        Dau_DsdNormalize_rec(pStr,p,pMatches);
        pbVar9 = (byte *)*p;
      }
      if (pbVar9 == pbVar1) {
        return;
      }
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0xff,"void Dau_DsdNormalize_rec(char *, char **, int *)");
    }
    pbVar1 = pbVar1 + 1;
    *p = (char *)pbVar1;
  } while( true );
}

Assistant:

void Dau_DsdNormalize_rec( char * pStr, char ** p, int * pMatches )
{
    static char pBuffer[DAU_MAX_STR];
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[*p - pStr];
        if ( *(q+1) == '{' )
            *p = q+1;
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
        return;
    if ( **p == '(' || **p == '[' ) // and/or/xor
    {
        char * pStore, * pOld = *p + 1;
        char * q = pStr + pMatches[ *p - pStr ];
        int i, * pPerm, nMarks = 0, pMarks[DAU_MAX_VAR+1];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            pMarks[nMarks++] = *p - pStr;
            Dau_DsdNormalize_rec( pStr, p, pMatches );
        }
        pMarks[nMarks] = *p - pStr;
        assert( *p == q );
        // add to buffer in good order
        pPerm = Dau_DsdNormalizePerm( pStr, pMarks, nMarks );
        // copy to the buffer
        pStore = pBuffer;
        for ( i = 0; i < nMarks; i++ )
            pStore = Dau_DsdNormalizeCopy( pStore, pStr, pMarks, pPerm[i] );
        assert( pStore - pBuffer == *p - pOld );
        memcpy( pOld, pBuffer, pStore - pBuffer );
        return;
    }
    if ( **p == '<' || **p == '{' ) // mux
    {
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        if ( (**p == '<') && (*(q+1) == '{') )
        {
            *p = q+1;
            Dau_DsdNormalize_rec( pStr, p, pMatches );
            return;
        }
        for ( (*p)++; *p < q; (*p)++ )
            Dau_DsdNormalize_rec( pStr, p, pMatches );
        assert( *p == q );
        return;
    }
    assert( 0 );
}